

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

TextureCube *
glu::TextureCube::create
          (RenderContext *context,ContextInfo *contextInfo,Archive *archive,int numLevels,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  deBool dVar1;
  size_type sVar2;
  TestError *this;
  value_type pcVar3;
  reference ppcVar4;
  TextureCube *pTVar5;
  int local_60;
  allocator<const_char_*> local_59;
  int ndx;
  vector<const_char_*,_std::allocator<const_char_*>_> charPtrs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames_local;
  int numLevels_local;
  Archive *archive_local;
  ContextInfo *contextInfo_local;
  RenderContext *context_local;
  
  while( true ) {
    dVar1 = ::deGetFalse();
    if (dVar1 != 0) break;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(filenames);
    if (numLevels * 6 != (int)sVar2) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(filenames);
      std::allocator<const_char_*>::allocator(&local_59);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx,sVar2,&local_59);
      std::allocator<const_char_*>::~allocator(&local_59);
      local_60 = 0;
      while( true ) {
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(filenames);
        if ((int)sVar2 <= local_60) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](filenames,(long)local_60);
        pcVar3 = (value_type)std::__cxx11::string::c_str();
        ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx,
                             (long)local_60);
        *ppcVar4 = pcVar3;
        local_60 = local_60 + 1;
      }
      ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx,0);
      pTVar5 = create(context,contextInfo,archive,numLevels,ppcVar4);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&ndx);
      return pTVar5;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"numLevels*tcu::CUBEFACE_LAST == (int)filenames.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x1d0);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

TextureCube* TextureCube::create (const RenderContext& context, const ContextInfo& contextInfo, const tcu::Archive& archive, int numLevels, const std::vector<std::string>& filenames)
{
	DE_STATIC_ASSERT(tcu::CUBEFACE_LAST == 6);
	TCU_CHECK(numLevels*tcu::CUBEFACE_LAST == (int)filenames.size());

	std::vector<const char*> charPtrs(filenames.size());
	for (int ndx = 0; ndx < (int)filenames.size(); ndx++)
		charPtrs[ndx] = filenames[ndx].c_str();

	return TextureCube::create(context, contextInfo, archive, numLevels, &charPtrs[0]);
}